

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::base_widget::render_attributes(base_widget *this,form_context *context)

{
  bool bVar1;
  html_type hVar2;
  ostream *poVar3;
  ulong uVar4;
  ostream *poVar5;
  form_context *in_RSI;
  base_widget *in_RDI;
  ostream *output;
  form_context *in_stack_000000d8;
  base_widget *in_stack_000000e0;
  
  auto_generate(in_stack_000000e0,in_stack_000000d8);
  poVar3 = form_context::out((form_context *)this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<(poVar3,"id=\"");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI->id_);
    std::operator<<(poVar5,"\" ");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<(poVar3,"name=\"");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI->name_);
    std::operator<<(poVar5,"\" ");
  }
  bVar1 = disabled(in_RDI);
  if (bVar1) {
    hVar2 = form_context::html(in_RSI);
    if (hVar2 == as_xhtml) {
      std::operator<<(poVar3,"disabled=\"disabled\" ");
    }
    else {
      std::operator<<(poVar3,"disabled ");
    }
  }
  return;
}

Assistant:

void base_widget::render_attributes(form_context &context)
{
	auto_generate(&context);
	std::ostream &output = context.out();
	if(!id_.empty()) output << "id=\"" << id_ << "\" ";
	if(!name_.empty()) output << "name=\"" << name_ << "\" ";
	if(disabled()) {
		if(context.html() == as_xhtml)
			output << "disabled=\"disabled\" ";
		else
			output << "disabled ";
	}
}